

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
             *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  ostream_type *local_38;
  char *pcStack_30;
  ostream_type *local_28;
  char *pcStack_20;
  
  if (*(long *)(this + 0x10) != 0) {
    local_28 = it->_M_stream;
    pcStack_20 = it->_M_string;
    internal::copy_str<char,char_const*,std::ostream_iterator<char,char,std::char_traits<char>>>
              ((char *)&local_48,*(char **)(this + 8),
               (ostream_iterator<char,_char,_std::char_traits<char>_> *)
               (*(char **)(this + 8) + *(long *)(this + 0x10)));
    it->_M_stream = local_48._M_stream;
    it->_M_string = local_48._M_string;
  }
  local_38 = it->_M_stream;
  pcStack_30 = it->_M_string;
  std::fill_n<std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long,char>
            (&local_48,(unsigned_long)&local_38,*(char **)(this + 0x20));
  it->_M_stream = local_48._M_stream;
  it->_M_string = local_48._M_string;
  int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }